

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O3

void __thiscall
irr::video::CNullDriver::makeColorKeyTexture(CNullDriver *this,ITexture *texture,SColor color)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  ushort uVar4;
  char *this_00;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  long lVar2;
  
  if (texture == (ITexture *)0x0) {
    return;
  }
  if (texture->ColorFormat == ECF_A1R5G5B5) {
    iVar1 = (**texture->_vptr_ITexture)(texture,0,0,0,1);
    lVar2 = CONCAT44(extraout_var_00,iVar1);
    in_XMM0_Qa = extraout_XMM0_Qa_00;
    if (lVar2 != 0) {
      iVar1 = (texture->Pitch >> 1) * (texture->Size).Height;
      if (iVar1 != 0) {
        uVar4 = (ushort)(color.color >> 3) & 0x1f |
                (ushort)(color.color >> 6) & 0x3e0 | (ushort)(color.color >> 9) & 0x7c00;
        lVar3 = 0;
        do {
          if ((*(ushort *)(lVar2 + lVar3 * 2) & 0x7fff) == uVar4) {
            *(ushort *)(lVar2 + lVar3 * 2) = uVar4;
          }
          lVar3 = lVar3 + 1;
        } while (iVar1 != (int)lVar3);
      }
LAB_001cada1:
      (*texture->_vptr_ITexture[1])(texture);
      (*texture->_vptr_ITexture[2])(texture,0,0);
      return;
    }
  }
  else {
    if (texture->ColorFormat != ECF_A8R8G8B8) {
      this_00 = "Error: Unsupported texture color format for making color key channel.";
      goto LAB_001cadd0;
    }
    iVar1 = (**texture->_vptr_ITexture)(texture,0,0,0,1);
    lVar2 = CONCAT44(extraout_var,iVar1);
    in_XMM0_Qa = extraout_XMM0_Qa;
    if (lVar2 != 0) {
      iVar1 = (texture->Pitch >> 2) * (texture->Size).Height;
      if (iVar1 != 0) {
        lVar3 = 0;
        do {
          if ((*(uint *)(lVar2 + lVar3 * 4) & 0xffffff) == (color.color & 0xffffff)) {
            *(u32 *)(lVar2 + lVar3 * 4) = color.color & 0xffffff;
          }
          lVar3 = lVar3 + 1;
        } while (iVar1 != (int)lVar3);
      }
      goto LAB_001cada1;
    }
  }
  this_00 = "Could not lock texture for making color key channel.";
LAB_001cadd0:
  os::Printer::log((Printer *)this_00,in_XMM0_Qa);
  return;
}

Assistant:

void CNullDriver::makeColorKeyTexture(video::ITexture *texture,
		video::SColor color) const
{
	if (!texture)
		return;

	if (texture->getColorFormat() != ECF_A1R5G5B5 &&
			texture->getColorFormat() != ECF_A8R8G8B8) {
		os::Printer::log("Error: Unsupported texture color format for making color key channel.", ELL_ERROR);
		return;
	}

	if (texture->getColorFormat() == ECF_A1R5G5B5) {
		u16 *p = (u16 *)texture->lock();

		if (!p) {
			os::Printer::log("Could not lock texture for making color key channel.", ELL_ERROR);
			return;
		}

		const core::dimension2d<u32> dim = texture->getSize();
		const u32 pitch = texture->getPitch() / 2;

		// color with alpha disabled (i.e. fully transparent)
		const u16 refZeroAlpha = (0x7fff & color.toA1R5G5B5());

		const u32 pixels = pitch * dim.Height;

		for (u32 pixel = 0; pixel < pixels; ++pixel) {
			// If the color matches the reference color, ignoring alphas,
			// set the alpha to zero.
			if (((*p) & 0x7fff) == refZeroAlpha)
				(*p) = refZeroAlpha;

			++p;
		}

		texture->unlock();
	} else {
		u32 *p = (u32 *)texture->lock();

		if (!p) {
			os::Printer::log("Could not lock texture for making color key channel.", ELL_ERROR);
			return;
		}

		core::dimension2d<u32> dim = texture->getSize();
		u32 pitch = texture->getPitch() / 4;

		// color with alpha disabled (fully transparent)
		const u32 refZeroAlpha = 0x00ffffff & color.color;

		const u32 pixels = pitch * dim.Height;
		for (u32 pixel = 0; pixel < pixels; ++pixel) {
			// If the color matches the reference color, ignoring alphas,
			// set the alpha to zero.
			if (((*p) & 0x00ffffff) == refZeroAlpha)
				(*p) = refZeroAlpha;

			++p;
		}

		texture->unlock();
	}
	texture->regenerateMipMapLevels();
}